

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O0

bool __thiscall QSplitter::restoreState(QSplitter *this,QByteArray *state)

{
  QSplitterPrivate *pQVar1;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  int version;
  QSplitterPrivate *d;
  qint32 v;
  qint32 marker;
  qint32 i;
  bool b;
  QList<int> list;
  QByteArray sd;
  QDataStream stream;
  undefined4 in_stack_ffffffffffffff58;
  OpenModeFlag in_stack_ffffffffffffff5c;
  QDataStream *pQVar2;
  undefined1 uVar3;
  undefined4 in_stack_ffffffffffffff88;
  Orientation in_stack_ffffffffffffff8c;
  byte bVar4;
  int iVar5;
  int iVar6;
  int local_68;
  bool local_61;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  uint local_44;
  Data *local_40;
  char *local_38;
  QSplitterPrivate *this_00;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = in_RDI;
  pQVar1 = d_func((QSplitter *)0x69dcb5);
  uVar3 = (undefined1)((ulong)pQVar2 >> 0x38);
  local_40 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = (QSplitterPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray
            ((QByteArray *)in_RDI,
             (QByteArray *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags
            ((QFlags<QIODeviceBase::OpenModeFlag> *)in_RDI,in_stack_ffffffffffffff5c);
  QDataStream::QDataStream
            ((QDataStream *)&local_28,(QByteArray *)&local_40,(QFlags_conflict1 *)(ulong)local_44);
  QDataStream::setVersion((QDataStream *)&local_28,0xd);
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QList<int>::QList((QList<int> *)0x69dd96);
  local_61 = true;
  local_68 = -0x55555556;
  iVar6 = -0x55555556;
  iVar5 = -0x55555556;
  QDataStream::operator>>((QDataStream *)&local_28,(int *)&stack0xffffffffffffff94);
  QDataStream::operator>>((QDataStream *)&local_28,(int *)&stack0xffffffffffffff90);
  if ((iVar6 == 0xff) && (iVar5 < 2)) {
    ::operator>>(in_RDI,(QList<int> *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))
    ;
    QSplitterPrivate::setSizes_helper
              ((QSplitterPrivate *)CONCAT44(iVar6,iVar5),
               (QList<int> *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
               (bool)uVar3);
    QDataStream::operator>>((QDataStream *)&local_28,&local_61);
    setChildrenCollapsible((QSplitter *)in_RDI,SUB41(in_stack_ffffffffffffff5c >> 0x18,0));
    QDataStream::operator>>((QDataStream *)&local_28,&local_68);
    setHandleWidth((QSplitter *)in_RDI,in_stack_ffffffffffffff5c);
    uVar3 = (undefined1)(in_stack_ffffffffffffff5c >> 0x18);
    QDataStream::operator>>((QDataStream *)&local_28,&local_61);
    setOpaqueResize((QSplitter *)in_RDI,(bool)uVar3);
    QDataStream::operator>>((QDataStream *)&local_28,&local_68);
    setOrientation((QSplitter *)CONCAT44(iVar6,iVar5),in_stack_ffffffffffffff8c);
    QSplitterPrivate::doResize(this_00);
    if (0 < iVar5) {
      QDataStream::operator>>((QDataStream *)&local_28,&pQVar1->opaqueResizeSet);
    }
    bVar4 = 1;
  }
  else {
    bVar4 = 0;
  }
  QList<int>::~QList((QList<int> *)0x69deeb);
  QDataStream::~QDataStream((QDataStream *)&local_28);
  QByteArray::~QByteArray((QByteArray *)0x69df02);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar4 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QSplitter::restoreState(const QByteArray &state)
{
    Q_D(QSplitter);
    int version = 1;
    QByteArray sd = state;
    QDataStream stream(&sd, QIODevice::ReadOnly);
    stream.setVersion(QDataStream::Qt_5_0);
    QList<int> list;
    bool b;
    qint32 i;
    qint32 marker;
    qint32 v;

    stream >> marker;
    stream >> v;
    if (marker != SplitterMagic || v > version)
        return false;

    stream >> list;
    d->setSizes_helper(list, false);

    stream >> b;
    setChildrenCollapsible(b);

    stream >> i;
    setHandleWidth(i);

    stream >> b;
    setOpaqueResize(b);

    stream >> i;
    setOrientation(Qt::Orientation(i));
    d->doResize();

    if (v >= 1)
        stream >> d->opaqueResizeSet;

    return true;
}